

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# UpnpSubscriptionRequest.c
# Opt level: O0

UpnpSubscriptionRequest * UpnpSubscriptionRequest_new(void)

{
  UpnpString *pUVar1;
  s_UpnpSubscriptionRequest *p;
  
  p = (s_UpnpSubscriptionRequest *)calloc(1,0x18);
  if (p == (s_UpnpSubscriptionRequest *)0x0) {
    p = (s_UpnpSubscriptionRequest *)0x0;
  }
  else {
    pUVar1 = UpnpString_new();
    p->m_ServiceId = pUVar1;
    pUVar1 = UpnpString_new();
    p->m_UDN = pUVar1;
    pUVar1 = UpnpString_new();
    p->m_SID = pUVar1;
  }
  return p;
}

Assistant:

UpnpSubscriptionRequest *UpnpSubscriptionRequest_new(void)
{
	struct s_UpnpSubscriptionRequest *p =
		calloc(1, sizeof(struct s_UpnpSubscriptionRequest));

	if (!p)
		return 0;

	p->m_ServiceId = UpnpString_new();
	p->m_UDN = UpnpString_new();
	p->m_SID = UpnpString_new();

	return (UpnpSubscriptionRequest *)p;
}